

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O2

CURLcode Curl_req_send(Curl_easy *data,dynbuf *req)

{
  size_t *psVar1;
  undefined1 *puVar2;
  CURLcode CVar3;
  uchar *buf;
  size_t blen;
  curl_off_t cVar4;
  ssize_t sVar5;
  CURLcode local_24;
  size_t nwritten;
  
  CVar3 = CURLE_FAILED_INIT;
  if ((data != (Curl_easy *)0x0) && (data->conn != (connectdata *)0x0)) {
    buf = (uchar *)Curl_dyn_ptr(req);
    blen = Curl_dyn_len(req);
    cVar4 = Curl_creader_total_length(data);
    if (cVar4 == 0) {
      puVar2 = &(data->req).field_0xd9;
      *puVar2 = *puVar2 | 0x20;
      CVar3 = xfer_send(data,(char *)buf,blen,blen,&nwritten);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      buf = buf + nwritten;
      blen = blen - nwritten;
    }
    if (blen == 0) {
      CVar3 = CURLE_OK;
    }
    else {
      local_24 = CURLE_OK;
      sVar5 = Curl_bufq_write(&(data->req).sendbuf,buf,blen,&local_24);
      if (sVar5 < 0) {
        if (local_24 != CURLE_OK) {
          return local_24;
        }
      }
      else {
        psVar1 = &(data->req).sendbuf_hds_len;
        *psVar1 = *psVar1 + blen;
      }
      CVar3 = Curl_req_send_more(data);
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_req_send(struct Curl_easy *data, struct dynbuf *req)
{
  CURLcode result;
  const char *buf;
  size_t blen, nwritten;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;

  buf = Curl_dyn_ptr(req);
  blen = Curl_dyn_len(req);
  if(!Curl_creader_total_length(data)) {
    /* Request without body. Try to send directly from the buf given. */
    data->req.eos_read = TRUE;
    result = xfer_send(data, buf, blen, blen, &nwritten);
    if(result)
      return result;
    buf += nwritten;
    blen -= nwritten;
  }

  if(blen) {
    /* Either we have a request body, or we could not send the complete
     * request in one go. Buffer the remainder and try to add as much
     * body bytes as room is left in the buffer. Then flush. */
    result = req_send_buffer_add(data, buf, blen, blen);
    if(result)
      return result;

    return Curl_req_send_more(data);
  }
  return CURLE_OK;
}